

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O1

int __thiscall OrderMoney::amount(OrderMoney *this)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  bool bVar3;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  (*((this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Money[3])
            (&local_58);
  (*((this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Money[3])
            (&local_38);
  bVar3 = true;
  if (local_50 == local_30) {
    if (local_50 == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = bcmp(local_58,local_38,local_50);
      bVar3 = iVar1 != 0;
    }
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (!bVar3) {
    iVar1 = (*((this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Money[2])();
    iVar2 = (*((this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Money[2])();
    return iVar2 + iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Multicurrency operations without convert");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int OrderMoney::amount() const
{
	if (a->currency() != b->currency()) {
		throw runtime_error("Multicurrency operations without convert");
	}
	return a->amount() + b->amount();
}